

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_sint64 PHYSFS_tell(PHYSFS_File *handle)

{
  long local_30;
  PHYSFS_sint64 retval;
  PHYSFS_sint64 pos;
  FileHandle *fh;
  PHYSFS_File *handle_local;
  
  local_30 = (**(code **)((long)handle->opaque + 0x28))(handle->opaque);
  if (*(char *)&handle[1].opaque == '\0') {
    local_30 = local_30 + (long)handle[5].opaque;
  }
  else {
    local_30 = (local_30 - (long)handle[5].opaque) + (long)handle[6].opaque;
  }
  return local_30;
}

Assistant:

PHYSFS_sint64 PHYSFS_tell(PHYSFS_File *handle)
{
    FileHandle *fh = (FileHandle *) handle;
    const PHYSFS_sint64 pos = fh->io->tell(fh->io);
    const PHYSFS_sint64 retval = fh->forReading ?
                                 (pos - fh->buffill) + fh->bufpos :
                                 (pos + fh->buffill);
    return retval;
}